

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getFreeFloatingMassMatrix
          (KinDynComputations *this,MatrixDynSize *freeFloatingMassMatrix)

{
  long lVar1;
  bool bVar2;
  MatrixStorageOrdering local_84;
  MatrixView<double> local_80;
  MatrixView<double> local_50;
  
  lVar1 = iDynTree::Model::getNrOfDOFs();
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize((ulong)freeFloatingMassMatrix,lVar1 + 6);
  local_84 = RowMajor;
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>
            (&local_50,freeFloatingMassMatrix,&local_84);
  getFreeFloatingMassMatrix(this,&local_50);
  local_84 = RowMajor;
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>
            (&local_80,freeFloatingMassMatrix,&local_84);
  bVar2 = getFreeFloatingMassMatrix(this,&local_80);
  return bVar2;
}

Assistant:

bool KinDynComputations::getFreeFloatingMassMatrix(MatrixDynSize& freeFloatingMassMatrix)
{
    // If the matrix has the right size, this should be inexpensive
    freeFloatingMassMatrix.resize(pimpl->m_robot_model.getNrOfDOFs()+6,pimpl->m_robot_model.getNrOfDOFs()+6);

    this->getFreeFloatingMassMatrix(MatrixView<double>(freeFloatingMassMatrix));

    // Return
    return this->getFreeFloatingMassMatrix(MatrixView<double>(freeFloatingMassMatrix));
}